

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O1

void __thiscall
test_vector_dense_constructors_initialiser_lists_Test::TestBody
          (test_vector_dense_constructors_initialiser_lists_Test *this)

{
  AssertHelper AVar1;
  AssertHelper AVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  pointer *__ptr;
  AssertionResult gtest_ar;
  DeathTest *gtest_dt;
  Vector_Dense<double,_3UL> static_vector;
  Vector_Dense<double,_0UL> dynamic_vector;
  initializer_list<double> local_d8;
  undefined1 local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  AssertHelper local_a0;
  Vector_Dense<double,_3UL> local_98;
  Vector_Dense<double,_0UL> local_80;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_68;
  Vector_Dense<double,_4UL> local_50;
  
  local_98.super_array<double,_3UL>._M_elems[0] = (double)local_c8;
  local_b8._0_1_ = false;
  local_b8._1_7_ = 0x40100000000000;
  uStack_b0 = 0xc020000000000000;
  local_c8 = (undefined1  [8])0x3ff0000000000000;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_4008000000000000;
  local_98.super_array<double,_3UL>._M_elems[1] = 1.97626258336499e-323;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_80,(initializer_list<double> *)&local_98);
  local_98.super_array<double,_3UL>._M_elems[0] =
       (double)((long)local_80.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_80.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  local_d8._M_array = (iterator)CONCAT44(local_d8._M_array._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_c8,"dynamic_vector.size()","4",(unsigned_long *)&local_98,
             (int *)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x23,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((iterator)local_98.super_array<double,_3UL>._M_elems[0] != (iterator)0x0) {
      (**(code **)((long)*(double *)local_98.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"dynamic_vector[0]","1.0",
             *local_80.super_vector<double,_std::allocator<double>_>.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start,1.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x24,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((iterator)local_98.super_array<double,_3UL>._M_elems[0] != (iterator)0x0) {
      (**(code **)((long)*(double *)local_98.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"dynamic_vector[1]","3.0",
             local_80.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1],3.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x25,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((iterator)local_98.super_array<double,_3UL>._M_elems[0] != (iterator)0x0) {
      (**(code **)((long)*(double *)local_98.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"dynamic_vector[2]","4.0",
             local_80.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2],4.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x26,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((iterator)local_98.super_array<double,_3UL>._M_elems[0] != (iterator)0x0) {
      (**(code **)((long)*(double *)local_98.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"dynamic_vector[3]","-8.0",
             local_80.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[3],-8.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x27,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if ((iterator)local_98.super_array<double,_3UL>._M_elems[0] != (iterator)0x0) {
      (**(code **)((long)*(double *)local_98.super_array<double,_3UL>._M_elems[0] + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  local_c8 = (undefined1  [8])0xc041000000000000;
  _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x404c000000000000;
  local_b8._0_1_ = false;
  local_b8._1_7_ = 0x40370000000000;
  local_d8._M_len = 3;
  local_d8._M_array = (iterator)local_c8;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense(&local_98,&local_d8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"static_vector[0]","-34.0",
             local_98.super_array<double,_3UL>._M_elems[0],-34.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((internal *)local_d8._M_array != (internal *)0x0) {
      (**(code **)((long)*local_d8._M_array + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"static_vector[1]","56.0",
             local_98.super_array<double,_3UL>._M_elems[1],56.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((internal *)local_d8._M_array != (internal *)0x0) {
      (**(code **)((long)*local_d8._M_array + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"static_vector[2]","23.0",
             local_98.super_array<double,_3UL>._M_elems[2],23.0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((internal *)local_d8._M_array != (internal *)0x0) {
      (**(code **)((long)*local_d8._M_array + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_c0._M_pi);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_d8._M_array = (iterator)0x147235;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_c8,
               (testing *)&local_d8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_68,(PolymorphicMatcher *)local_c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("(Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0}))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0x2e,(DeathTest **)&local_a0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_68);
    AVar1.data_ = local_a0.data_;
    bVar3 = true;
    if (bVar4) {
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        iVar6 = (**(code **)(*(long *)local_a0.data_ + 0x10))(local_a0.data_);
        AVar2.data_ = local_a0.data_;
        if (iVar6 == 0) {
          iVar6 = (**(code **)(*(long *)local_a0.data_ + 0x18))(local_a0.data_);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar6);
          cVar5 = (**(code **)(*(long *)local_a0.data_ + 0x20))(local_a0.data_,bVar3);
          if (cVar5 != '\0') goto LAB_0010ba9c;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar6 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              local_c8 = (undefined1  [8])0xc041000000000000;
              _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x404c000000000000;
              local_b8._0_1_ = false;
              local_b8._1_7_ = 0x40370000000000;
              local_d8._M_len = 3;
              local_d8._M_array = (iterator)local_c8;
              Disa::Vector_Dense<double,_4UL>::Vector_Dense(&local_50,&local_d8);
            }
            (**(code **)(*(long *)local_a0.data_ + 0x28))(local_a0.data_,2);
            (**(code **)(*(long *)AVar2.data_ + 0x28))(AVar2.data_,0);
          }
LAB_0010ba9c:
          bVar3 = false;
          bVar4 = true;
        }
        (**(code **)(*(long *)AVar1.data_ + 8))(AVar1.data_);
        if (!bVar4) goto LAB_0010bab1;
      }
      bVar3 = false;
    }
LAB_0010bab1:
    if (!bVar3) goto LAB_0010bb06;
  }
  testing::Message::Message((Message *)local_c8);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
             ,0x2e,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)local_c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  if (local_c8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_c8 + 8))();
  }
LAB_0010bb06:
  if (local_80.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (double *)0x0) {
    operator_delete(local_80.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, constructors_initialiser_lists) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 3.0, 4.0, -8.0};
  EXPECT_EQ(dynamic_vector.size(), 4);
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], 4.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[3], -8.0);

  Vector_Dense<Scalar, 3> static_vector = {-34.0, 56.0, 23.0};
  EXPECT_DOUBLE_EQ(static_vector[0], -34.0);
  EXPECT_DOUBLE_EQ(static_vector[1], 56.0);
  EXPECT_DOUBLE_EQ(static_vector[2], 23.0);

  EXPECT_DEATH((Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0})), "./*");
}